

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_swift_generator.cc
# Opt level: O2

void __thiscall t_swift_generator::generate_typedef(t_swift_generator *this,t_typedef *ttypedef)

{
  ostream *poVar1;
  t_type *ttype;
  string local_60;
  string local_40;
  
  t_generator::indent_abi_cxx11_(&local_40,(t_generator *)this);
  poVar1 = std::operator<<((ostream *)&this->f_decl_,(string *)&local_40);
  poVar1 = std::operator<<(poVar1,"public typealias ");
  poVar1 = std::operator<<(poVar1,(string *)&ttypedef->symbolic_);
  poVar1 = std::operator<<(poVar1," = ");
  ttype = t_typedef::get_type(ttypedef);
  type_name_abi_cxx11_(&local_60,this,ttype,false,false);
  poVar1 = std::operator<<(poVar1,(string *)&local_60);
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  std::operator<<((ostream *)&this->f_decl_,(string *)&::endl_abi_cxx11_);
  return;
}

Assistant:

void t_swift_generator::generate_typedef(t_typedef* ttypedef) {
  f_decl_ << indent() << "public typealias " << ttypedef->get_symbolic()
          << " = " << type_name(ttypedef->get_type()) << endl;
  f_decl_ << endl;
}